

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O1

Result __thiscall
tonk::Connection::InitializeOutgoingConnection
          (Connection *this,Dependencies *deps,TonkSocketConfig *socketConfig,
          TonkConnectionConfig *connectionConfig,char *serverHostname,uint16_t serverPort)

{
  atomic<int> *paVar1;
  int *piVar2;
  in6_addr *this_00;
  ostringstream *this_01;
  io_context *piVar3;
  ConnectionAddrMap *pCVar4;
  HostnameResolverState *__ptr;
  long *plVar5;
  long lVar6;
  undefined8 uVar7;
  _func_uint32_t_TonkAppContextPtr_TonkConnection_TonkAddress_ptr_TonkConnectionConfig_ptr *p_Var8;
  undefined8 uVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  RefCounter *pRVar12;
  IUDPSender *pIVar13;
  ConnectionIdMap *pCVar14;
  ConnectionIdMap *pCVar15;
  P2PConnectionKeyMap *pPVar16;
  MappedPortLifetime *pMVar17;
  bool bVar18;
  int iVar19;
  pointer __p;
  ConnectionAddrMap *pCVar20;
  undefined8 *puVar21;
  _func_int **pp_Var22;
  basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *this_02;
  long *plVar23;
  resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
  *prVar24;
  error_category *peVar25;
  OutputWorker *pOVar26;
  thread_info_base *this_thread;
  undefined6 in_register_0000008a;
  uint16_t in_stack_00000008;
  uint8_t keyBytes [8];
  allocator local_391;
  shared_ptr<asio::io_context> *local_390;
  anon_class_8_1_8991fb9c local_388;
  ptr local_380;
  undefined1 local_368 [32];
  io_context_impl *local_348;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [16];
  undefined1 auStack_1a8 [32];
  _Alloc_hider local_188;
  WindowHeader *local_180;
  undefined1 local_178 [24];
  WindowHeader *local_160;
  undefined1 local_158 [296];
  
  (this->super_IConnection)._vptr_IConnection = (_func_int **)0x0;
  pRVar12 = *(RefCounter **)socketConfig;
  pIVar13 = (IUDPSender *)socketConfig->AppContextPtr;
  pCVar20 = *(ConnectionAddrMap **)&socketConfig->WorkerCount;
  pCVar14 = *(ConnectionIdMap **)&socketConfig->UDPRecvBufferSizeBytes;
  pCVar15 = *(ConnectionIdMap **)&socketConfig->UDPRecvBufferSizeBytes;
  pPVar16 = *(P2PConnectionKeyMap **)&socketConfig->MaximumClients;
  pMVar17 = *(MappedPortLifetime **)&socketConfig->MinuteFloodThresh;
  deps[1].AddressMap = *(ConnectionAddrMap **)&socketConfig->WorkerCount;
  deps[1].IdMap = pCVar15;
  deps[1].P2PKeyMap = pPVar16;
  deps[1].MappedPort = pMVar17;
  deps[1].SocketRefCount = pRVar12;
  deps[1].UDPSender = pIVar13;
  deps[1].AddressMap = pCVar20;
  deps[1].IdMap = pCVar14;
  deps[1].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)&socketConfig->NoDataTimeoutUsec;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&deps[1].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&socketConfig->ConnectionTimeoutUsec);
  deps[1].DisconnectHandler = (FloodDetector *)socketConfig->InterfaceAddress;
  uVar7 = *(undefined8 *)&socketConfig->BandwidthLimitBPS;
  p_Var8 = socketConfig->OnIncomingConnection;
  uVar9 = *(undefined8 *)((long)&socketConfig->OnP2PConnectionStart + 4);
  *(undefined8 *)((long)&deps[1].DisconnectAddrKey.impl_.data_ + 0xc) =
       *(undefined8 *)((long)&socketConfig->OnIncomingConnection + 4);
  *(undefined8 *)((long)&deps[1].DisconnectAddrKey.impl_.data_ + 0x14) = uVar9;
  *(undefined8 *)&deps[1].DisconnectAddrKey.impl_.data_ = uVar7;
  *(_func_uint32_t_TonkAppContextPtr_TonkConnection_TonkAddress_ptr_TonkConnectionConfig_ptr **)
   ((long)&deps[1].DisconnectAddrKey.impl_.data_ + 8) = p_Var8;
  deps[1].NATPool = (INATPortPool *)socketConfig->SendToAppContextPtr;
  deps[2].SocketRefCount = (RefCounter *)connectionConfig;
  pCVar20 = *(ConnectionAddrMap **)(serverHostname + 8);
  pCVar14 = *(ConnectionIdMap **)(serverHostname + 0x10);
  pPVar16 = *(P2PConnectionKeyMap **)(serverHostname + 0x18);
  deps[2].UDPSender = *(IUDPSender **)serverHostname;
  deps[2].AddressMap = pCVar20;
  deps[2].IdMap = pCVar14;
  deps[2].P2PKeyMap = pPVar16;
  deps[2].MappedPort = *(MappedPortLifetime **)(serverHostname + 0x20);
  LOCK();
  paVar1 = &(deps[1].SocketRefCount)->RefCount;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_390 = &deps[2].Context;
  std::__cxx11::string::string
            ((string *)local_1b8,(char *)CONCAT62(in_register_0000008a,serverPort),
             (allocator *)local_368);
  GetConnectionLogPrefix((string *)local_340,(string *)local_1b8,in_stack_00000008);
  logger::Channel::SetPrefix((Channel *)&deps[2].Context,(string *)local_340);
  if ((ErrorResult *)local_340._0_8_ != (ErrorResult *)(local_340 + 0x10)) {
    operator_delete((void *)local_340._0_8_);
  }
  if ((ErrorResult *)local_1b8._0_8_ != (ErrorResult *)auStack_1a8) {
    operator_delete((void *)local_1b8._0_8_);
  }
  piVar3 = deps[1].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar20 = (ConnectionAddrMap *)operator_new(0x10,(nothrow_t *)&std::nothrow);
  if (pCVar20 == (ConnectionAddrMap *)0x0) {
    pCVar20 = (ConnectionAddrMap *)0x0;
  }
  else {
    asio::io_context::strand::strand((strand *)pCVar20,piVar3);
  }
  pCVar4 = deps[0x1ca].AddressMap;
  deps[0x1ca].AddressMap = pCVar20;
  if (pCVar4 != (ConnectionAddrMap *)0x0) {
    operator_delete(pCVar4);
  }
  if (deps[0x1ca].AddressMap == (ConnectionAddrMap *)0x0) {
    local_340._0_8_ = local_340 + 0x10;
    local_340._8_8_ = 0;
    local_330[0]._M_local_buf[0] = '\0';
    pp_Var22 = (_func_int **)operator_new(0x38);
    *pp_Var22 = (_func_int *)"Out of memory";
    pp_Var22[1] = (_func_int *)(pp_Var22 + 3);
    pp_Var22[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var22 + 3) = 0;
    *(undefined4 *)(pp_Var22 + 5) = 0;
    pp_Var22[6] = (_func_int *)0x10;
    (this->super_IConnection)._vptr_IConnection = pp_Var22;
    local_1b8._0_8_ = (ErrorResult *)0x0;
    Result::~Result((Result *)local_1b8);
  }
  else {
    puVar21 = (undefined8 *)operator_new(0x30,(nothrow_t *)&std::nothrow);
    if (puVar21 == (undefined8 *)0x0) {
      puVar21 = (undefined8 *)0x0;
    }
    else {
      puVar21[2] = 0;
      puVar21[3] = 0;
      puVar21[4] = 0;
      puVar21[5] = 0;
      *puVar21 = 0;
      puVar21[1] = 0;
      puVar21[2] = 0;
      puVar21[3] = 0;
    }
    this_00 = &deps[0x1c8].DisconnectAddrKey.impl_.data_.v6.sin6_addr;
    local_340._0_8_ = (ErrorResult *)0x0;
    __ptr = *(HostnameResolverState **)((long)&deps[0x1c8].DisconnectAddrKey.impl_.data_ + 8);
    *(undefined8 **)((long)&deps[0x1c8].DisconnectAddrKey.impl_.data_ + 8) = puVar21;
    if (__ptr != (HostnameResolverState *)0x0) {
      std::default_delete<tonk::HostnameResolverState>::operator()
                ((default_delete<tonk::HostnameResolverState> *)this_00,__ptr);
    }
    if ((ErrorResult *)local_340._0_8_ != (ErrorResult *)0x0) {
      std::default_delete<tonk::HostnameResolverState>::operator()
                ((default_delete<tonk::HostnameResolverState> *)local_340,
                 (HostnameResolverState *)local_340._0_8_);
    }
    **(uint16_t **)((long)&deps[0x1c8].DisconnectAddrKey.impl_.data_ + 8) = in_stack_00000008;
    piVar3 = deps[1].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    this_02 = (basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *)
              operator_new(0x18,(nothrow_t *)&std::nothrow);
    if (this_02 == (basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *)0x0) {
      this_02 = (basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *)0x0;
    }
    else {
      asio::basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false>::basic_io_object
                (this_02,piVar3);
    }
    std::
    __uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
    ::reset((__uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
             *)(*(long *)&this_00->__in6_u + 8),(pointer)this_02);
    SecureRandom_Next((tonk *)local_340,local_368,8);
    (this->super_IConnection)._vptr_IConnection = (_func_int **)local_340._0_8_;
    local_340._0_8_ = (ErrorResult *)0x0;
    Result::~Result((Result *)local_340);
    if ((this->super_IConnection)._vptr_IConnection == (_func_int **)0x0) {
      deps[0x1cb].MappedPort = (MappedPortLifetime *)local_368._0_8_;
      initSubsystems((Connection *)local_340);
      (this->super_IConnection)._vptr_IConnection = (_func_int **)local_340._0_8_;
      local_340._0_8_ = (ErrorResult *)0x0;
      Result::~Result((Result *)local_340);
      if ((this->super_IConnection)._vptr_IConnection == (_func_int **)0x0) {
        SessionOutgoing::StartHandshakeC2SConnect
                  ((SessionOutgoing *)&deps[3].IdMap,(uint64_t)deps[0x1cb].MappedPort);
        resetTimers((Connection *)deps,
                    ((deps[2].SocketRefCount)->ShutdownLock).super___mutex_base._M_mutex.__data.
                    __owner,false);
        if (InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
            ::kAnyProtocolStr_abi_cxx11_ == '\0') {
          iVar19 = __cxa_guard_acquire(&InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                                        ::kAnyProtocolStr_abi_cxx11_);
          if (iVar19 != 0) {
            InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
            ::kAnyProtocolStr_abi_cxx11_._M_dataplus._M_p =
                 (pointer)&InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                           ::kAnyProtocolStr_abi_cxx11_.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)
                       &InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                        ::kAnyProtocolStr_abi_cxx11_,"");
            __cxa_atexit(std::__cxx11::string::~string,
                         &InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                          ::kAnyProtocolStr_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                                 ::kAnyProtocolStr_abi_cxx11_);
          }
        }
        LOCK();
        *(int *)&(deps->Context).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(deps->Context).
                      super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
        plVar5 = *(long **)(*(long *)((long)&deps[0x1c8].DisconnectAddrKey.impl_.data_ + 8) + 8);
        std::__cxx11::string::string
                  ((string *)local_340,(char *)CONCAT62(in_register_0000008a,serverPort),&local_391)
        ;
        local_388.this = (Connection *)deps;
        asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
                  ((basic_resolver_query<asio::ip::tcp> *)local_1b8,(string *)local_340,
                   &InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                    ::kAnyProtocolStr_abi_cxx11_,0);
        lVar6 = *plVar5;
        local_380.h = &local_388;
        plVar23 = (long *)__tls_get_addr();
        if (*plVar23 == 0) {
          this_thread = (thread_info_base *)0x0;
        }
        else {
          this_thread = *(thread_info_base **)(*plVar23 + 8);
        }
        prVar24 = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
                   *)asio::detail::thread_info_base::allocate(this_thread,0xc0);
        local_380.p = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
                       *)0x0;
        peVar10 = (element_type *)plVar5[1];
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[2];
        plVar5 = (long *)plVar5[2];
        if (plVar5 != (long *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((long)plVar5 + 0xc) = *(int *)((long)plVar5 + 0xc) + 1;
            UNLOCK();
          }
          else {
            *(int *)((long)plVar5 + 0xc) = *(int *)((long)plVar5 + 0xc) + 1;
          }
        }
        local_348 = ((resolver_service_base *)(lVar6 + 0x28))->io_context_impl_;
        (prVar24->super_operation).next_ = (scheduler_operation *)0x0;
        (prVar24->super_operation).func_ =
             asio::detail::
             resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:380:13)>
             ::do_complete;
        (prVar24->super_operation).task_result_ = 0;
        (prVar24->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar10
        ;
        (prVar24->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var11;
        if (plVar5 != (long *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((long)plVar5 + 0xc) = *(int *)((long)plVar5 + 0xc) + 1;
            UNLOCK();
          }
          else {
            *(int *)((long)plVar5 + 0xc) = *(int *)((long)plVar5 + 0xc) + 1;
          }
        }
        *(undefined8 *)&(prVar24->query_).hints_.ai_addrlen = auStack_1a8._0_8_;
        (prVar24->query_).hints_.ai_addr = (sockaddr *)auStack_1a8._8_8_;
        (prVar24->query_).hints_.ai_canonname = (char *)auStack_1a8._16_8_;
        (prVar24->query_).hints_.ai_next = (addrinfo *)auStack_1a8._24_8_;
        (prVar24->query_).hints_.ai_flags = local_1b8._0_4_;
        (prVar24->query_).hints_.ai_family = local_1b8._4_4_;
        (prVar24->query_).hints_.ai_socktype = local_1b8._8_4_;
        (prVar24->query_).hints_.ai_protocol = local_1b8._12_4_;
        *(undefined8 *)&(prVar24->query_).hints_.ai_addrlen = auStack_1a8._0_8_;
        (prVar24->query_).hints_.ai_addr = (sockaddr *)auStack_1a8._8_8_;
        (prVar24->query_).host_name_._M_dataplus._M_p =
             (pointer)&(prVar24->query_).host_name_.field_2;
        local_380.v = prVar24;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(prVar24->query_).host_name_,local_188._M_p,
                   &local_180->Used + (long)local_188._M_p);
        (prVar24->query_).service_name_._M_dataplus._M_p =
             (pointer)&(prVar24->query_).service_name_.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(prVar24->query_).service_name_,local_178._16_8_,
                   (pointer)(local_178._16_8_ + (long)&local_160->Used));
        prVar24->io_context_impl_ = local_348;
        (prVar24->handler_).this = local_388.this;
        (prVar24->ec_)._M_value = 0;
        peVar25 = (error_category *)std::_V2::system_category();
        (prVar24->ec_)._M_cat = peVar25;
        prVar24->addrinfo_ = (addrinfo_type *)0x0;
        local_380.p = prVar24;
        if (plVar5 != (long *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar2 = (int *)((long)plVar5 + 0xc);
            iVar19 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
          }
          else {
            iVar19 = *(int *)((long)plVar5 + 0xc);
            *(int *)((long)plVar5 + 0xc) = iVar19 + -1;
          }
          if (iVar19 == 1) {
            (**(code **)(*plVar5 + 0x18))(plVar5);
          }
        }
        asio::detail::resolver_service_base::start_resolve_op
                  ((resolver_service_base *)(lVar6 + 0x28),&(local_380.p)->super_operation);
        local_380.v = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
                       *)0x0;
        local_380.p = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
                       *)0x0;
        asio::detail::
        resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:380:13)>
        ::ptr::reset(&local_380);
        if ((WindowHeader *)local_178._16_8_ != (WindowHeader *)local_158) {
          operator_delete((void *)local_178._16_8_);
        }
        if ((WindowHeader *)local_188._M_p != (WindowHeader *)local_178) {
          operator_delete(local_188._M_p);
        }
        if ((ErrorResult *)local_340._0_8_ != (ErrorResult *)(local_340 + 0x10)) {
          operator_delete((void *)local_340._0_8_);
        }
        bVar18 = ConnectionIdMap::InsertAndAssignId
                           (deps[1].IdMap,(id_t *)&deps[0x1cb].Context,(IConnection *)deps);
        if (!bVar18 &&
            *(int *)&deps[2].Context.
                     super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi < 4) {
          local_1b8._0_8_ =
               (local_390->super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_1b8._8_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_1a8,(char *)deps[2].NATPool,(long)deps[3].SocketRefCount);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_1a8,"Failed to insert new connection into map",0x28);
          pOVar26 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar26,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
          std::ios_base::~ios_base((ios_base *)(local_158 + 0x20));
        }
        postNextTimer((Connection *)deps);
      }
    }
  }
  if ((this->super_IConnection)._vptr_IConnection != (_func_int **)0x0) {
    Result::ToJson_abi_cxx11_((string *)local_368,(Result *)this);
    if (*(int *)&deps[2].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi < 4) {
      local_340._0_8_ =
           (local_390->super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_01 = (ostringstream *)(local_340 + 0x10);
      local_340._8_4_ = 3;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,(char *)deps[2].NATPool,(long)deps[3].SocketRefCount);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"Connection::InitializeOutgoingConnection failed: ",0x31);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,(char *)local_368._0_8_,local_368._8_8_);
      pOVar26 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar26,(LogStringBuffer *)local_340);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base(local_2c0);
    }
    if ((MappedPortLifetime *)local_368._0_8_ != (MappedPortLifetime *)(local_368 + 0x10)) {
      operator_delete((void *)local_368._0_8_);
    }
    Shutdown((Connection *)deps);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result Connection::InitializeOutgoingConnection(
    const Dependencies& deps,
    const TonkSocketConfig* socketConfig,
    const TonkConnectionConfig& connectionConfig,
    const char* serverHostname,
    uint16_t serverPort)
{
    Result result;

    try
    {
        Deps = deps;
        SocketConfig = socketConfig;
        ConnectionConfig = connectionConfig;

        // Add reference to socket
        Deps.SocketRefCount->IncrementReferences();

        Logger.SetPrefix(GetConnectionLogPrefix(serverHostname, serverPort));

        AsioEventStrand = MakeUniqueNoThrow<asio::io_context::strand>(*Deps.Context);
        if (!AsioEventStrand)
        {
            result = Result::OutOfMemory();
            goto OnError;
        }

        ResolverState = MakeUniqueNoThrow<HostnameResolverState>();
        ResolverState->ServerUDPPort = serverPort;
        ResolverState->Resolver = MakeUniqueNoThrow<asio::ip::tcp::resolver>(*Deps.Context);

#ifdef TONK_DISABLE_OUTGOING_ENCRYPTION
        EncryptionKey = 0;
#else // TONK_DISABLE_OUTGOING_ENCRYPTION
        uint8_t keyBytes[8];
        result = SecureRandom_Next(keyBytes, 8);
        if (result.IsFail()) {
            goto OnError;
        }
        EncryptionKey = siamese::ReadU64_LE(keyBytes);
#endif // TONK_DISABLE_OUTGOING_ENCRYPTION

        result = initSubsystems();
        if (result.IsFail()) {
            goto OnError;
        }

        // Start attaching handshake to each outgoing datagram
        Outgoing.StartHandshakeC2SConnect(EncryptionKey);

        // Initialize timers for outgoing connection
        resetTimers(SocketConfig->ConnectionTimeoutUsec, false);

        //----------------------------------------------------------------------
        // Connection creation cannot fail past this point
        //----------------------------------------------------------------------

        // Allow any protocol
        static const std::string kAnyProtocolStr = "";

        // Kick off async resolve after initialization
        SelfRefCount.IncrementReferences();
        ResolverState->Resolver->async_resolve(serverHostname, kAnyProtocolStr,
            [this](const asio::error_code& error, const asio::ip::tcp::resolver::results_type& results)
        {
            onResolve(error, results);
            SelfRefCount.DecrementReferences();
        });

        /*
            This is the right time to assign a Connection Id, before any
            messages are queued for delivery to the peer.

            The Connection Id is used to reconnect if the source IP address or
            port changes during a connection.  Both client and server in a
            connection are assigned a Connection Id by the other side.
            And both peers are able to change their source address by sending
            a valid datagram with the ID flag set.
        */
        if (!Deps.IdMap->InsertAndAssignId(LocallyAssignedIdForRemoteHost, this))
        {
            // Id assignment can only fail if too many clients were allowed to
            // connect, which should not be possible.
            TONK_DEBUG_BREAK();
            Logger.Warning("Failed to insert new connection into map");
        }

        postNextTimer();

        /*
            Do not immediately flush queued messages - The application decides
            when to flush the initial data so that it can be included in the
            first connection request datagram to the server.
        */
    }
    catch (...)
    {
        TONK_DEBUG_BREAK(); // Should never happen except out of memory error
        result = Result("Connection::InitializeOutgoingConnection", "Exception!", ErrorType::Tonk);
    }

OnError:
    if (result.IsFail())
    {
        Logger.Warning("Connection::InitializeOutgoingConnection failed: ", result.ToJson());
        Shutdown();
    }

    return result;
}